

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::EraseTx(WalletBatch *this,uint256 hash)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  pStack_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&pStack_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::TX_abi_cxx11_);
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x10] =
       hash.super_base_blob<256U>.m_data._M_elems[0x10];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x11] =
       hash.super_base_blob<256U>.m_data._M_elems[0x11];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x12] =
       hash.super_base_blob<256U>.m_data._M_elems[0x12];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x13] =
       hash.super_base_blob<256U>.m_data._M_elems[0x13];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x14] =
       hash.super_base_blob<256U>.m_data._M_elems[0x14];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x15] =
       hash.super_base_blob<256U>.m_data._M_elems[0x15];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x16] =
       hash.super_base_blob<256U>.m_data._M_elems[0x16];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x17] =
       hash.super_base_blob<256U>.m_data._M_elems[0x17];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x18] =
       hash.super_base_blob<256U>.m_data._M_elems[0x18];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x19] =
       hash.super_base_blob<256U>.m_data._M_elems[0x19];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1a] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1b] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1c] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1d] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1e] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0x1f] =
       hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0] =
       hash.super_base_blob<256U>.m_data._M_elems[0];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[1] =
       hash.super_base_blob<256U>.m_data._M_elems[1];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[2] =
       hash.super_base_blob<256U>.m_data._M_elems[2];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[3] =
       hash.super_base_blob<256U>.m_data._M_elems[3];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[4] =
       hash.super_base_blob<256U>.m_data._M_elems[4];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[5] =
       hash.super_base_blob<256U>.m_data._M_elems[5];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[6] =
       hash.super_base_blob<256U>.m_data._M_elems[6];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[7] =
       hash.super_base_blob<256U>.m_data._M_elems[7];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[8] =
       hash.super_base_blob<256U>.m_data._M_elems[8];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[9] =
       hash.super_base_blob<256U>.m_data._M_elems[9];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[10] =
       hash.super_base_blob<256U>.m_data._M_elems[10];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0xb] =
       hash.super_base_blob<256U>.m_data._M_elems[0xb];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0xc] =
       hash.super_base_blob<256U>.m_data._M_elems[0xc];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0xd] =
       hash.super_base_blob<256U>.m_data._M_elems[0xd];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0xe] =
       hash.super_base_blob<256U>.m_data._M_elems[0xe];
  pStack_58.second.super_base_blob<256U>.m_data._M_elems[0xf] =
       hash.super_base_blob<256U>.m_data._M_elems[0xf];
  bVar1 = EraseIC<std::pair<std::__cxx11::string,uint256>>(this,&pStack_58);
  std::__cxx11::string::~string((string *)&pStack_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseTx(uint256 hash)
{
    return EraseIC(std::make_pair(DBKeys::TX, hash));
}